

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t __thiscall httplib::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  Request *req;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  req = (Request *)CONCAT44(in_register_00000034,__fd);
  if ((req->path)._M_string_length == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = detail::
            create_socket<httplib::Client::create_client_socket()const::_lambda(int,addrinfo&)_1_>
                      ((this->host_)._M_dataplus._M_p,this->port_,(anon_class_8_1_8991fb9c)this,0);
    if (uVar2 != 0xffffffff) {
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58 = (undefined8 *)0x0;
      uStack_50 = 0;
      local_58 = (undefined8 *)operator_new(0x18);
      *local_58 = this;
      local_58[1] = req;
      local_58[2] = __buf;
      pcStack_40 = std::
                   _Function_handler<bool_(httplib::Stream_&,_bool,_bool_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/build_O1/external/httplib/src/httplib/httplib.h:2998:16)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(httplib::Stream_&,_bool,_bool_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/build_O1/external/httplib/src/httplib/httplib.h:2998:16)>
                 ::_M_manager;
      uVar3 = (*this->_vptr_Client[3])(this,(ulong)uVar2,1,&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      if (((this->follow_location_ != 0 & (byte)uVar3) == 1) &&
         (*(int *)((long)__buf + 0x20) - 0x12dU < 99)) {
        bVar1 = redirect(this,req,(Response *)__buf);
        uVar3 = (uint)CONCAT71(extraout_var,bVar1);
      }
    }
  }
  return (ulong)uVar3;
}

Assistant:

inline std::string file_extension(const std::string &path) {
  std::smatch m;
  auto re = std::regex("\\.([a-zA-Z0-9]+)$");
  if (std::regex_search(path, m, re)) { return m[1].str(); }
  return std::string();
}